

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O1

int IDABBDPrecSetup(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,sunrealtype c_j,
                   void *bbd_data)

{
  long lVar1;
  double dVar2;
  IDAMem IDA_mem;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  sunrealtype *psVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long j;
  bool bVar28;
  ulong uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  long local_a8;
  long local_a0;
  
  IDA_mem = *(IDAMem *)((long)bbd_data + 0x98);
  SUNMatZero(*(undefined8 *)((long)bbd_data + 0x40));
  uVar3 = *(undefined8 *)((long)bbd_data + 0x60);
  uVar4 = *(undefined8 *)((long)bbd_data + 0x68);
  uVar5 = *(undefined8 *)((long)bbd_data + 0x70);
  uVar6 = *(undefined8 *)((long)bbd_data + 0x78);
  lVar7 = *(long *)((long)bbd_data + 0x98);
  N_VScale(0x3ff0000000000000,yy);
  N_VScale(0x3ff0000000000000,yp,uVar5);
  lVar12 = N_VGetArrayPointer(yy);
  lVar13 = N_VGetArrayPointer(yp);
  lVar14 = N_VGetArrayPointer(uVar6);
  lVar15 = N_VGetArrayPointer(*(undefined8 *)(lVar7 + 0x180));
  if (*(int *)(lVar7 + 0x58) == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = N_VGetArrayPointer(*(undefined8 *)(lVar7 + 0x1b8));
  }
  lVar16 = N_VGetArrayPointer(uVar4);
  lVar17 = N_VGetArrayPointer(uVar5);
  lVar18 = N_VGetArrayPointer(uVar3);
  if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
     (iVar11 = (**(code **)((long)bbd_data + 0x30))
                         (tt,*(undefined8 *)((long)bbd_data + 0x38),yy,yp,
                          *(undefined8 *)(lVar7 + 0x18)), iVar11 == 0)) {
    iVar11 = (**(code **)((long)bbd_data + 0x28))
                       (tt,*(undefined8 *)((long)bbd_data + 0x38),yy,yp,uVar3,
                        *(undefined8 *)(lVar7 + 0x18));
    *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
    if (iVar11 == 0) {
      lVar8 = *bbd_data;
      lVar9 = *(long *)((long)bbd_data + 8);
      lVar23 = lVar9 + lVar8 + 1;
      lVar25 = *(long *)((long)bbd_data + 0x38);
      if (lVar23 < *(long *)((long)bbd_data + 0x38)) {
        lVar25 = lVar23;
      }
      if (0 < lVar25) {
        local_a0 = 0;
        lVar19 = 1;
        do {
          j = lVar19 + -1;
          lVar27 = *(long *)((long)bbd_data + 0x38);
          if (lVar19 <= lVar27) {
            iVar11 = *(int *)(lVar7 + 0x58);
            lVar21 = j;
            do {
              dVar2 = *(double *)(lVar12 + lVar21 * 8);
              dVar30 = *(double *)(lVar13 + lVar21 * 8) * *(double *)(lVar7 + 0x290);
              dVar31 = ABS(dVar30);
              dVar32 = 1.0 / *(double *)(lVar15 + lVar21 * 8);
              if (dVar31 <= dVar32) {
                dVar31 = dVar32;
              }
              dVar32 = ABS(dVar2);
              if (ABS(dVar2) <= dVar31) {
                dVar32 = dVar31;
              }
              dVar32 = dVar32 * *(double *)((long)bbd_data + 0x20);
              uVar29 = -(ulong)(dVar30 < 0.0);
              dVar31 = ((double)((ulong)-dVar32 & uVar29 | ~uVar29 & (ulong)dVar32) + dVar2) - dVar2
              ;
              if (iVar11 != 0) {
                dVar30 = *(double *)(local_a8 + lVar21 * 8);
                dVar32 = ABS(dVar30);
                if ((dVar32 != 1.0) || (NAN(dVar32))) {
                  if ((dVar32 == 2.0) && ((!NAN(dVar32) && ((dVar2 + dVar31) * dVar30 <= 0.0))))
                  goto LAB_0010f411;
                }
                else if ((dVar2 + dVar31) * dVar30 < 0.0) {
LAB_0010f411:
                  dVar31 = -dVar31;
                }
              }
              *(double *)(lVar16 + lVar21 * 8) = dVar31 + *(double *)(lVar16 + lVar21 * 8);
              *(double *)(lVar17 + lVar21 * 8) = c_j * dVar31 + *(double *)(lVar17 + lVar21 * 8);
              lVar21 = lVar21 + lVar23;
            } while (lVar21 < lVar27);
          }
          iVar11 = (**(code **)((long)bbd_data + 0x28))
                             (tt,lVar27,uVar4,uVar5,uVar6,*(undefined8 *)(lVar7 + 0x18));
          *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
          if (iVar11 != 0) goto LAB_0010f64f;
          lVar27 = local_a0;
          if (lVar19 <= *(long *)((long)bbd_data + 0x38)) {
            do {
              dVar2 = *(double *)(lVar12 + j * 8);
              *(double *)(lVar16 + j * 8) = dVar2;
              dVar31 = *(double *)(lVar13 + j * 8);
              *(double *)(lVar17 + j * 8) = dVar31;
              dVar31 = dVar31 * *(double *)(lVar7 + 0x290);
              dVar30 = ABS(dVar31);
              dVar32 = 1.0 / *(double *)(lVar15 + j * 8);
              if (dVar30 <= dVar32) {
                dVar30 = dVar32;
              }
              dVar32 = ABS(dVar2);
              if (ABS(dVar2) <= dVar30) {
                dVar32 = dVar30;
              }
              dVar32 = dVar32 * *(double *)((long)bbd_data + 0x20);
              uVar29 = -(ulong)(dVar31 < 0.0);
              dVar31 = ((double)((ulong)-dVar32 & uVar29 | ~uVar29 & (ulong)dVar32) + dVar2) - dVar2
              ;
              if (*(int *)(lVar7 + 0x58) != 0) {
                dVar30 = *(double *)(local_a8 + j * 8);
                dVar32 = ABS(dVar30);
                if ((dVar32 != 1.0) || (NAN(dVar32))) {
                  if ((dVar32 == 2.0) && ((!NAN(dVar32) && ((dVar2 + dVar31) * dVar30 <= 0.0))))
                  goto LAB_0010f57e;
                }
                else if ((dVar2 + dVar31) * dVar30 < 0.0) {
LAB_0010f57e:
                  dVar31 = -dVar31;
                }
              }
              psVar20 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x40),j);
              lVar22 = j - *(long *)((long)bbd_data + 0x10);
              lVar21 = 0;
              if (0 < lVar22) {
                lVar21 = lVar22;
              }
              lVar10 = *(long *)((long)bbd_data + 0x38);
              lVar26 = *(long *)((long)bbd_data + 0x18) + j;
              lVar1 = lVar10 + -1;
              if (lVar1 <= lVar26) {
                lVar26 = lVar1;
              }
              if (lVar21 <= lVar26) {
                if (lVar22 < 1) {
                  lVar22 = 0;
                }
                lVar22 = lVar22 + -1;
                do {
                  *(double *)((long)psVar20 + lVar22 * 8 + lVar27 + 8) =
                       (*(double *)(lVar14 + 8 + lVar22 * 8) - *(double *)(lVar18 + 8 + lVar22 * 8))
                       * (1.0 / dVar31);
                  lVar22 = lVar22 + 1;
                } while (lVar22 < lVar26);
              }
              j = j + lVar23;
              lVar27 = lVar27 + ~(lVar9 + lVar8) * 8;
            } while (j < lVar10);
          }
          local_a0 = local_a0 + -8;
          bVar28 = lVar19 != lVar25;
          lVar19 = lVar19 + 1;
        } while (bVar28);
      }
      iVar11 = 0;
    }
  }
LAB_0010f64f:
  if (iVar11 < 0) {
    iVar24 = -1;
    IDAProcessError(IDA_mem,-1,0x1db,"IDABBDPrecSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"The Glocal or Gcomm routine failed in an unrecoverable manner.");
  }
  else {
    iVar24 = 1;
    if (iVar11 == 0) {
      iVar11 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                   *(SUNMatrix *)((long)bbd_data + 0x40));
      return iVar11;
    }
  }
  return iVar24;
}

Assistant:

static int IDABBDPrecSetup(sunrealtype tt, N_Vector yy, N_Vector yp,
                           SUNDIALS_MAYBE_UNUSED N_Vector rr, sunrealtype c_j,
                           void* bbd_data)
{
  IBBDPrecData pdata;
  IDAMem IDA_mem;
  int retval;

  pdata = (IBBDPrecData)bbd_data;

  IDA_mem = (IDAMem)pdata->ida_mem;

  /* Call IBBDDQJac for a new Jacobian calculation and store in PP. */
  retval = SUNMatZero(pdata->PP);
  retval = IBBDDQJac(pdata, tt, c_j, yy, yp, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3, pdata->tempv4);
  if (retval < 0)
  {
    IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }
  if (retval > 0) { return (1); }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}